

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  long lVar1;
  ushort uVar2;
  TcParseTableBase *pTVar3;
  bool bVar4;
  uint uVar5;
  MessageLite *pMVar6;
  ulong uVar7;
  string *psVar8;
  char *pcVar9;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aVar10;
  undefined8 uVar11;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar12;
  int iVar13;
  RepeatedPtrFieldBase *ptr_00;
  uint *puVar14;
  undefined8 uVar15;
  int iVar16;
  long lVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  RepeatedPtrFieldBase local_60;
  RepeatedPtrFieldBase *local_48;
  TcParseTableBase *local_40;
  TcParseTableBase *local_38;
  
  if (data.field_0._0_2_ != 0) {
    pcVar9 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar9;
  }
  local_48 = (RepeatedPtrFieldBase *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30))
  ;
  if (((ulong)local_48 & 7) != 0) {
    AlignFail(local_48);
  }
  local_38 = *(TcParseTableBase **)
              ((long)&table->has_bits_offset +
              ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  local_60.arena_._4_4_ = (uint)*(ushort *)ptr;
  aVar10._0_4_ = (int)(char)*(ushort *)ptr + local_60.arena_._4_4_ >> 1;
  aVar10.data._4_4_ = 0;
  local_40 = local_38 + 1;
  local_60.arena_._0_4_ = aVar10._0_4_;
  do {
    ptr_00 = local_48;
    pMVar6 = AddMessage(local_38,local_48);
    pTVar3 = local_40;
    auVar18._8_8_ = extraout_RDX;
    auVar18._0_8_ = local_60.tagged_rep_or_elem_;
    iVar16 = ctx->depth_;
    lVar1 = (long)iVar16 + -1;
    iVar13 = (int)lVar1;
    ctx->depth_ = iVar13;
    if ((long)iVar16 < 1) {
      ptr = (char *)0x0;
    }
    else {
      lVar17 = (long)ctx->group_depth_ + 1;
      iVar16 = (int)lVar17;
      ctx->group_depth_ = iVar16;
      local_60.tagged_rep_or_elem_ =
           (RepeatedPtrFieldBase *)((long)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_ + 2);
      while( true ) {
        ptr_00 = &local_60;
        bVar4 = EpsCopyInputStream::DoneWithCheck
                          (&ctx->super_EpsCopyInputStream,(char **)&local_60,ctx->group_depth_);
        auVar18._8_8_ = extraout_RDX_00;
        auVar18._0_8_ = local_60.tagged_rep_or_elem_;
        if (bVar4) break;
        uVar5 = (uint)pTVar3[-1].fast_idx_mask &
                (uint)*(ushort *)(void **)local_60.tagged_rep_or_elem_;
        if ((uVar5 & 7) != 0) goto LAB_00293cb7;
        uVar7 = (ulong)(uVar5 & 0xfffffff8);
        aVar10.data = (ulong)*(ushort *)(void **)local_60.tagged_rep_or_elem_ ^
                      *(ulong *)(&pTVar3->fast_idx_mask + uVar7 * 2);
        auVar18 = (**(code **)(&pTVar3->has_bits_offset + uVar7))
                            (pMVar6,local_60.tagged_rep_or_elem_,ctx,aVar10.data,pTVar3 + -1,0);
        ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
        if ((auVar18._0_8_ == (RepeatedPtrFieldBase *)0x0) ||
           (local_60.tagged_rep_or_elem_ = auVar18._0_8_,
           (ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
      }
      local_60.tagged_rep_or_elem_ = auVar18._0_8_;
      ptr = (char *)local_60.tagged_rep_or_elem_;
      if ((pTVar3[-1].field_0x9 & 1) != 0) {
        ptr_00 = (RepeatedPtrFieldBase *)local_60.tagged_rep_or_elem_;
        auVar19 = (undefined1  [16])
                  (*pTVar3[-1].post_loop_handler)(pMVar6,(char *)local_60.tagged_rep_or_elem_,ctx);
        auVar18._8_8_ = auVar19._8_8_;
        auVar18._0_8_ = local_60.tagged_rep_or_elem_;
        ptr = (char *)auVar19._0_8_;
      }
      local_60.tagged_rep_or_elem_ = auVar18._0_8_;
      if ((RepeatedPtrFieldBase *)ptr != (RepeatedPtrFieldBase *)0x0) {
        if (iVar13 == ctx->depth_) {
          psVar8 = (string *)0x0;
        }
        else {
          psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar1,(long)ctx->depth_,"old_depth == depth_");
          auVar18._8_8_ = extraout_RDX_01;
          auVar18._0_8_ = local_60.tagged_rep_or_elem_;
        }
        local_60.tagged_rep_or_elem_ = auVar18._0_8_;
        if (psVar8 != (string *)0x0) {
          uVar15 = *(undefined8 *)psVar8;
          uVar11 = *(undefined8 *)(psVar8 + 8);
          uVar12 = 0x45b;
LAB_00293d07:
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_60,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,uVar12,uVar11,uVar15);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_60);
        }
        ptr_00 = (RepeatedPtrFieldBase *)(long)ctx->group_depth_;
        if (iVar16 == ctx->group_depth_) {
          psVar8 = (string *)0x0;
        }
        else {
          psVar8 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                             (lVar17,(long)ptr_00,"old_group_depth == group_depth_");
          auVar18._8_8_ = extraout_RDX_02;
          auVar18._0_8_ = local_60.tagged_rep_or_elem_;
        }
        local_60.tagged_rep_or_elem_ = auVar18._0_8_;
        if (psVar8 != (string *)0x0) {
          uVar15 = *(undefined8 *)psVar8;
          uVar11 = *(undefined8 *)(psVar8 + 8);
          uVar12 = 0x45c;
          goto LAB_00293d07;
        }
      }
      ctx->group_depth_ = ctx->group_depth_ + -1;
      ctx->depth_ = ctx->depth_ + 1;
      uVar5 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
      (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
      if (uVar5 != (uint)local_60.arena_) {
        ptr = (char *)0x0;
      }
    }
    local_60.tagged_rep_or_elem_ = auVar18._0_8_;
    if ((RepeatedPtrFieldBase *)ptr == (RepeatedPtrFieldBase *)0x0) {
      pcVar9 = Error(msg,(char *)ptr_00,auVar18._8_8_,(TcFieldData)aVar10,table,hasbits);
      return pcVar9;
    }
    if ((RepeatedPtrFieldBase *)(ctx->super_EpsCopyInputStream).limit_end_ <= ptr) {
      if ((ulong)table->has_bits_offset != 0) {
        puVar14 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
        if (((ulong)puVar14 & 3) != 0) {
          AlignFail();
        }
        *puVar14 = *puVar14 | (uint)hasbits;
      }
      return (char *)(RepeatedPtrFieldBase *)ptr;
    }
    uVar2 = *(ushort *)&((RepeatedPtrFieldBase *)ptr)->tagged_rep_or_elem_;
    aVar10.data._2_6_ = 0;
    aVar10.data._0_2_ = uVar2;
    if (uVar2 != local_60.arena_._4_2_) {
      uVar5 = (uint)table->fast_idx_mask & (uint)uVar2;
      if ((uVar5 & 7) == 0) {
        uVar7 = (ulong)(uVar5 & 0xfffffff8);
        pcVar9 = (char *)(**(code **)(&table[1].has_bits_offset + uVar7))
                                   (msg,ptr,ctx,
                                    aVar10.data ^ *(ulong *)(&table[1].fast_idx_mask + uVar7 * 2),
                                    table,hasbits);
        return pcVar9;
      }
LAB_00293cb7:
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}